

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

FlowEdge * __thiscall
FlowGraph::AddEdge(FlowGraph *this,BasicBlock *blockPred,BasicBlock *blockSucc)

{
  RealCount *pRVar1;
  FlowEdge *pFVar2;
  Type pSVar3;
  
  pFVar2 = (FlowEdge *)new<Memory::JitArenaAllocator>(0x18,this->alloc,0x3f1274);
  pFVar2->predBlock = (BasicBlock *)0x0;
  pFVar2->succBlock = (BasicBlock *)0x0;
  pFVar2->pathDependentInfo = (PathDependentInfo *)0x0;
  pFVar2->predBlock = blockPred;
  pFVar2->succBlock = blockSucc;
  pSVar3 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x366bee);
  pSVar3[1].next = (Type)pFVar2;
  pSVar3->next = (blockPred->succList).
                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (blockPred->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar3;
  pRVar1 = &(blockPred->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  pSVar3 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x366bee);
  pSVar3[1].next = (Type)pFVar2;
  pSVar3->next = (blockSucc->predList).
                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (blockSucc->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar3;
  pRVar1 = &(blockSucc->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return pFVar2;
}

Assistant:

FlowEdge *
FlowGraph::AddEdge(BasicBlock * blockPred, BasicBlock * blockSucc)
{
    FlowEdge * edge = FlowEdge::New(this);
    edge->SetPred(blockPred);
    edge->SetSucc(blockSucc);
    blockPred->AddSucc(edge, this);
    blockSucc->AddPred(edge, this);

    return edge;
}